

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O2

bool __thiscall
dtc::fdt::checking::check_manager::run_checks(check_manager *this,device_tree *tree,bool keep_going)

{
  bool bVar1;
  bool bVar2;
  __node_base *p_Var3;
  
  p_Var3 = &(this->checkers)._M_h._M_before_begin;
  bVar2 = true;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) {
      return bVar2;
    }
    bVar1 = checker::check_tree((checker *)p_Var3[5]._M_nxt,tree);
    bVar2 = bVar2 != false && bVar1;
  } while (bVar2 || keep_going);
  return false;
}

Assistant:

bool
check_manager::run_checks(device_tree *tree, bool keep_going)
{
	bool success = true;
	for (auto &i : checkers)
	{
		success &= i.second->check_tree(tree);
		if (!(success || keep_going))
		{
			break;
		}
	}
	return success;
}